

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::python::Generator::CopyPublicDependenciesAliases
          (Generator *this,string *copy_from,FileDescriptor *file)

{
  FileDescriptor *pFVar1;
  long lVar2;
  string module_alias;
  string module_name;
  
  if (0 < *(int *)(file + 0x38)) {
    lVar2 = 0;
    do {
      pFVar1 = FileDescriptor::dependency(file,*(int *)(*(long *)(file + 0x40) + lVar2 * 4));
      anon_unknown_0::ModuleName(&module_name,*(string **)pFVar1);
      pFVar1 = FileDescriptor::dependency(file,*(int *)(*(long *)(file + 0x40) + lVar2 * 4));
      anon_unknown_0::ModuleAlias(&module_alias,*(string **)pFVar1);
      io::Printer::Print(this->printer_,
                         "try:\n  $alias$ = $copy_from$.$alias$\nexcept AttributeError:\n  $alias$ = $copy_from$.$module$\n"
                         ,"alias",&module_alias,"module",&module_name,"copy_from",copy_from);
      pFVar1 = FileDescriptor::dependency(file,*(int *)(*(long *)(file + 0x40) + lVar2 * 4));
      CopyPublicDependenciesAliases(this,copy_from,pFVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)module_alias._M_dataplus._M_p != &module_alias.field_2) {
        operator_delete(module_alias._M_dataplus._M_p,module_alias.field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)module_name._M_dataplus._M_p != &module_name.field_2) {
        operator_delete(module_name._M_dataplus._M_p,module_name.field_2._M_allocated_capacity + 1);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < *(int *)(file + 0x38));
  }
  return;
}

Assistant:

void Generator::CopyPublicDependenciesAliases(
    const string& copy_from, const FileDescriptor* file) const {
  for (int i = 0; i < file->public_dependency_count(); ++i) {
    string module_name = ModuleName(file->public_dependency(i)->name());
    string module_alias = ModuleAlias(file->public_dependency(i)->name());
    // There's no module alias in the dependent file if it was generated by
    // an old protoc (less than 3.0.0-alpha-1). Use module name in this
    // situation.
    printer_->Print("try:\n"
                    "  $alias$ = $copy_from$.$alias$\n"
                    "except AttributeError:\n"
                    "  $alias$ = $copy_from$.$module$\n",
                    "alias", module_alias,
                    "module", module_name,
                    "copy_from", copy_from);
    CopyPublicDependenciesAliases(copy_from, file->public_dependency(i));
  }
}